

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O2

Node * cookmem::PtrAVLTree::rotateWithRightChild(Node *root)

{
  Node *node;
  
  node = root->right;
  root->right = node->left;
  node->left = root;
  updateHeight(root);
  updateHeight(node);
  return node;
}

Assistant:

inline static Node*
    rotateWithRightChild (Node* root)
    {
        Node* right = root->right;
        setRightChild (root, right->left);
        setLeftChild (right, root);
        updateHeight (root);
        updateHeight (right);
        return right;
    }